

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm_file_dumper.cpp
# Opt level: O0

void __thiscall VGMFileDumper::nativeGenerateN(VGMFileDumper *this,int16_t *output,size_t frames)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  size_t frames_local;
  int16_t *output_local;
  VGMFileDumper *this_local;
  
  if (((this->m_output != (FILE *)0x0) && (this->m_chip_index < 1)) &&
     ((this->m_end_caught & 1U) == 0)) {
    memset(output,0,frames << 2);
    auVar3._8_4_ = (int)(frames >> 0x20);
    auVar3._0_8_ = frames;
    auVar3._12_4_ = 0x45300000;
    dVar2 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)frames) - 4503599627370496.0)) *
            (44100.0 / (double)this->m_actual_rate);
    uVar1 = (ulong)dVar2;
    this->m_delay =
         (uVar1 | (long)(dVar2 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f) + this->m_delay;
  }
  return;
}

Assistant:

void VGMFileDumper::nativeGenerateN(int16_t *output, size_t frames)
{
    if(!m_output)
        return;
    if(m_chip_index > 0 || m_end_caught) // When it's a second chip
        return;
    std::memset(output, 0, frames * sizeof(int16_t) * 2);
    m_delay += size_t(frames * (44100.0 / double(m_actual_rate)));
}